

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.cpp
# Opt level: O1

string * stackjit::anon_unknown_16::findInheritedMemberFunction
                   (string *__return_storage_ptr__,VMState *vmState,string *initialSignature,
                   ClassType *classType,string *name,
                   vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                   *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  Binder *this;
  ClassMetadata *pCVar5;
  ClassType *pCVar6;
  string signature;
  string local_d0;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *local_b0;
  string local_a8;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_88;
  string local_70;
  FunctionSignature local_50;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + name->_M_string_length);
  local_b0 = parameters;
  FunctionSignature::memberFunction(&local_50,classType,&local_a8,parameters);
  psVar4 = FunctionSignature::str_abi_cxx11_(&local_50);
  paVar1 = &local_d0.field_2;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.mSignature._M_dataplus._M_p != &local_50.mSignature.field_2) {
    operator_delete(local_50.mSignature._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (initialSignature->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)initialSignature);
  }
  this = VMState::binder(vmState);
  bVar3 = Binder::isDefined(this,&local_d0);
  if (bVar3) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar1) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,local_d0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_d0._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,local_d0.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_d0._M_string_length;
    local_d0._M_string_length = 0;
    local_d0.field_2._M_local_buf[0] = '\0';
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    pCVar5 = ClassType::metadata(classType);
    pCVar6 = ClassMetadata::parentClass(pCVar5);
    if (pCVar6 == (ClassType *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (initialSignature->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + initialSignature->_M_string_length
                );
    }
    else {
      pCVar5 = ClassType::metadata(classType);
      pCVar6 = ClassMetadata::parentClass(pCVar5);
      pcVar2 = (name->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + name->_M_string_length);
      std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
                (&local_88,local_b0);
      findInheritedMemberFunction
                (__return_storage_ptr__,vmState,initialSignature,pCVar6,&local_70,&local_88);
      if (local_88.
          super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string findInheritedMemberFunction(const VMState& vmState,
												std::string& initialSignature,
												const ClassType* classType,
												std::string name,
												const std::vector<const Type*> parameters) {
			std::string signature = FunctionSignature::memberFunction(
				classType,
				name,
				parameters).str();

			if (initialSignature.empty()) {
				initialSignature = signature;
			}

			if (vmState.binder().isDefined(signature)) {
				return signature;
			}

			if (classType->metadata()->parentClass() != nullptr) {
				return findInheritedMemberFunction(
					vmState,
					initialSignature,
					classType->metadata()->parentClass(),
					name,
					parameters);
			} else {
				return initialSignature;
			}
		}